

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void custom_compare_variable_test(void)

{
  fdb_encryption_key *pfVar1;
  undefined8 uVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  fdb_doc *pfVar6;
  ulong uVar7;
  uint uVar8;
  char *__format;
  kvs_ops_stat *in_R8;
  long lVar9;
  code *pcVar10;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db2;
  uint64_t user_param;
  void *params [1];
  fdb_custom_cmp_variable functions [1];
  char *kvs_names [1];
  timeval __test_begin;
  char keybuf [256];
  char prev_key [256];
  fdb_config fconfig;
  char bodybuf [256];
  undefined1 local_23e8 [24];
  undefined1 local_23d0 [40];
  undefined1 local_23a8 [32];
  timeval local_2388;
  fdb_kvs_handle local_2378;
  fdb_config local_2170;
  btree local_2078 [4];
  fdb_doc *local_1f78 [1001];
  
  gettimeofday(&local_2388,(__timezone_ptr_t)0x0);
  memleak_start();
  local_23e8._0_8_ = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_2170.seqtree_opt = '\x01';
  local_2170.buffercache_size = 0;
  local_2170.wal_threshold = 0x400;
  local_2170.flags = 1;
  local_2170.compaction_threshold = '\0';
  local_2170.multi_kv_instances = true;
  local_23d0._32_8_ = local_23a8;
  local_23a8._0_8_ = (fdb_file_handle *)0x1234;
  local_23d0._24_8_ = _cmp_variable;
  fdb_open((fdb_file_handle **)local_23d0,"./dummy1",&local_2170);
  fdb_kvs_open_default
            ((fdb_file_handle *)local_23d0._0_8_,(fdb_kvs_handle **)(local_23e8 + 0x10),
             (fdb_kvs_config *)(local_23d0 + 0x10));
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_23e8._16_8_,logCallbackFunc,
                     "custom_compare_variable_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    uVar7 = 0;
    do {
      iVar4 = rand();
      local_2378.kvs_config.create_if_missing =
           (bool)((char)iVar4 +
                  ((char)(uint)((ulong)((long)iVar4 * 0x51eb851f) >> 0x23) - (char)(iVar4 >> 0x1f))
                  * -0x19 + 'a');
      iVar4 = rand();
      local_2378.kvs_config._1_1_ =
           (char)iVar4 +
           ((char)(uint)((ulong)((long)iVar4 * 0x51eb851f) >> 0x23) - (char)(iVar4 >> 0x1f)) * -0x19
           + 'a';
      sprintf(&local_2378.kvs_config.field_0x2,"%06d",uVar7 & 0xffffffff);
      lVar9 = 8;
      do {
        iVar4 = rand();
        *(char *)((long)&local_2378.kvs_config.create_if_missing + lVar9) =
             (char)iVar4 + (char)(iVar4 / 0x19) * -0x19 + 'a';
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0xf);
      local_2378.kvs_config.custom_cmp._7_1_ = 0;
      sprintf((char *)local_2078,"value: %d",uVar7 & 0xffffffff);
      sVar5 = strlen((char *)local_2078);
      fdb_doc_create(local_1f78 + uVar7,&local_2378,0x10,(void *)0x0,0,local_2078,sVar5 + 1);
      fdb_set((fdb_kvs_handle *)local_23e8._16_8_,local_1f78[uVar7]);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 1000);
    lVar9 = 0;
    do {
      in_R8 = (kvs_ops_stat *)0x0;
      fdb_doc_create((fdb_doc **)local_23e8,local_1f78[lVar9]->key,local_1f78[lVar9]->keylen,
                     (void *)0x0,0,(void *)0x0,0);
      fVar3 = fdb_get((fdb_kvs_handle *)local_23e8._16_8_,(fdb_doc *)local_23e8._0_8_);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        custom_compare_variable_test();
LAB_00115845:
        custom_compare_variable_test();
        goto LAB_00115850;
      }
      sVar5 = *(size_t *)(local_23e8._0_8_ + 0x10);
      pfVar6 = local_1f78[lVar9];
      if (sVar5 != pfVar6->bodylen) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
               );
        custom_compare_variable_test()::__test_pass = '\x01';
        sVar5 = *(size_t *)(local_23e8._0_8_ + 0x10);
        pfVar6 = local_1f78[lVar9];
        if (sVar5 != pfVar6->bodylen) {
          __assert_fail("rdoc->bodylen == doc[i]->bodylen",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa0d,"void custom_compare_variable_test()");
        }
      }
      uVar2 = local_23e8._0_8_;
      iVar4 = bcmp(*(btree **)(local_23e8._0_8_ + 0x40),(fdb_kvs_handle *)pfVar6->body,sVar5);
      if (iVar4 != 0) goto LAB_00115845;
      fdb_doc_free((fdb_doc *)uVar2);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 1000);
    in_R8 = (kvs_ops_stat *)0x0;
    fdb_iterator_init((fdb_kvs_handle *)local_23e8._16_8_,(fdb_iterator **)(local_23e8 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    pfVar1 = &local_2378.config.encryption_key;
    sprintf((char *)pfVar1,"%016d",0);
    pcVar10 = (code *)0x10;
    uVar8 = 1000;
    do {
      fVar3 = fdb_iterator_get((fdb_iterator *)local_23e8._8_8_,(fdb_doc **)local_23e8);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00115850;
      in_R8 = (kvs_ops_stat *)local_23d0._32_8_;
      iVar4 = _cmp_variable(pfVar1,(size_t)pcVar10,*(void **)(local_23e8._0_8_ + 0x20),
                            (size_t)*(size_t *)local_23e8._0_8_,(void *)local_23d0._32_8_);
      if (0 < iVar4) {
        custom_compare_variable_test();
      }
      uVar2 = local_23e8._0_8_;
      pcVar10 = (code *)*(size_t *)local_23e8._0_8_;
      memcpy(pfVar1,*(btree **)(local_23e8._0_8_ + 0x20),(size_t)pcVar10);
      fdb_doc_free((fdb_doc *)uVar2);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      fVar3 = fdb_iterator_next((fdb_iterator *)local_23e8._8_8_);
      uVar8 = uVar8 - 1;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar8 != 0) goto LAB_00115893;
    fdb_iterator_close((fdb_iterator *)local_23e8._8_8_);
    fdb_commit((fdb_file_handle *)local_23d0._0_8_,'\x01');
    in_R8 = (kvs_ops_stat *)0x0;
    fdb_iterator_init((fdb_kvs_handle *)local_23e8._16_8_,(fdb_iterator **)(local_23e8 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    pfVar1 = &local_2378.config.encryption_key;
    sprintf((char *)pfVar1,"%016d",0);
    pcVar10 = (code *)0x10;
    uVar8 = 1000;
    do {
      fVar3 = fdb_iterator_get((fdb_iterator *)local_23e8._8_8_,(fdb_doc **)local_23e8);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00115855;
      in_R8 = (kvs_ops_stat *)local_23d0._32_8_;
      iVar4 = _cmp_variable(pfVar1,(size_t)pcVar10,*(void **)(local_23e8._0_8_ + 0x20),
                            (size_t)*(size_t *)local_23e8._0_8_,(void *)local_23d0._32_8_);
      if (0 < iVar4) {
        custom_compare_variable_test();
      }
      uVar2 = local_23e8._0_8_;
      pcVar10 = (code *)*(size_t *)local_23e8._0_8_;
      memcpy(pfVar1,*(btree **)(local_23e8._0_8_ + 0x20),(size_t)pcVar10);
      fdb_doc_free((fdb_doc *)uVar2);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      fVar3 = fdb_iterator_next((fdb_iterator *)local_23e8._8_8_);
      uVar8 = uVar8 - 1;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar8 != 0) goto LAB_00115898;
    fdb_iterator_close((fdb_iterator *)local_23e8._8_8_);
    fdb_compact((fdb_file_handle *)local_23d0._0_8_,"./dummy2");
    in_R8 = (kvs_ops_stat *)0x0;
    fdb_iterator_init((fdb_kvs_handle *)local_23e8._16_8_,(fdb_iterator **)(local_23e8 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    pfVar1 = &local_2378.config.encryption_key;
    sprintf((char *)pfVar1,"%016d",0);
    pcVar10 = (code *)0x10;
    uVar8 = 1000;
    do {
      fVar3 = fdb_iterator_get((fdb_iterator *)local_23e8._8_8_,(fdb_doc **)local_23e8);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011585a;
      in_R8 = (kvs_ops_stat *)local_23d0._32_8_;
      iVar4 = _cmp_variable(pfVar1,(size_t)pcVar10,*(void **)(local_23e8._0_8_ + 0x20),
                            (size_t)*(size_t *)local_23e8._0_8_,(void *)local_23d0._32_8_);
      if (0 < iVar4) {
        custom_compare_variable_test();
      }
      uVar2 = local_23e8._0_8_;
      pcVar10 = (code *)*(size_t *)local_23e8._0_8_;
      memcpy(pfVar1,*(btree **)(local_23e8._0_8_ + 0x20),(size_t)pcVar10);
      fdb_doc_free((fdb_doc *)uVar2);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      fVar3 = fdb_iterator_next((fdb_iterator *)local_23e8._8_8_);
      uVar8 = uVar8 - 1;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar8 != 0) goto LAB_0011589d;
    fdb_iterator_close((fdb_iterator *)local_23e8._8_8_);
    in_R8 = (kvs_ops_stat *)0x0;
    fdb_iterator_sequence_init
              ((fdb_kvs_handle *)local_23e8._16_8_,(fdb_iterator **)(local_23e8 + 8),0,0,0);
    uVar8 = 1000;
    do {
      fVar3 = fdb_iterator_get((fdb_iterator *)local_23e8._8_8_,(fdb_doc **)local_23e8);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011585f;
      fdb_doc_free((fdb_doc *)local_23e8._0_8_);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      fVar3 = fdb_iterator_next((fdb_iterator *)local_23e8._8_8_);
      uVar8 = uVar8 - 1;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar8 != 0) goto LAB_001158a2;
    fVar3 = fdb_iterator_prev((fdb_iterator *)local_23e8._8_8_);
    if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
LAB_00115889:
      custom_compare_variable_test();
      goto LAB_0011588e;
    }
    uVar8 = 0xfffffc18;
    do {
      fVar3 = fdb_iterator_get((fdb_iterator *)local_23e8._8_8_,(fdb_doc **)local_23e8);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00115864;
      fdb_doc_free((fdb_doc *)local_23e8._0_8_);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      fVar3 = fdb_iterator_prev((fdb_iterator *)local_23e8._8_8_);
      uVar8 = uVar8 + 1;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar8 != 0) goto LAB_00115889;
    fdb_iterator_close((fdb_iterator *)local_23e8._8_8_);
    local_23d0._24_8_ = (kvs_info *)0x0;
    local_23d0._32_8_ = (kvs_ops_stat *)0x0;
    fdb_kvs_open_default
              ((fdb_file_handle *)local_23d0._0_8_,(fdb_kvs_handle **)(local_23d0 + 8),
               (fdb_kvs_config *)(local_23d0 + 0x10));
    lVar9 = 0;
    do {
      in_R8 = (kvs_ops_stat *)0x0;
      fdb_doc_create((fdb_doc **)local_23e8,local_1f78[lVar9]->key,local_1f78[lVar9]->keylen,
                     (void *)0x0,0,(void *)0x0,0);
      fVar3 = fdb_get((fdb_kvs_handle *)local_23d0._8_8_,(fdb_doc *)local_23e8._0_8_);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00115869;
      sVar5 = *(size_t *)(local_23e8._0_8_ + 0x10);
      pfVar6 = local_1f78[lVar9];
      if (sVar5 != pfVar6->bodylen) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
               );
        custom_compare_variable_test()::__test_pass = '\x01';
        sVar5 = *(size_t *)(local_23e8._0_8_ + 0x10);
        pfVar6 = local_1f78[lVar9];
        if (sVar5 != pfVar6->bodylen) {
          __assert_fail("rdoc->bodylen == doc[i]->bodylen",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xa76,"void custom_compare_variable_test()");
        }
      }
      uVar2 = local_23e8._0_8_;
      iVar4 = bcmp(*(btree **)(local_23e8._0_8_ + 0x40),(fdb_kvs_handle *)pfVar6->body,sVar5);
      if (iVar4 != 0) goto LAB_0011586e;
      fdb_doc_free((fdb_doc *)uVar2);
      local_23e8._0_8_ = (fdb_doc *)0x0;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 1000);
    fdb_kvs_close((fdb_kvs_handle *)local_23e8._16_8_);
    fdb_kvs_close((fdb_kvs_handle *)local_23d0._8_8_);
    fdb_close((fdb_file_handle *)local_23d0._0_8_);
    in_R8 = (kvs_ops_stat *)(local_23a8 + 0x18);
    local_23a8._24_8_ = (btree *)0x0;
    local_23a8._16_8_ = _cmp_variable;
    local_23a8._8_8_ = local_23a8;
    fVar3 = fdb_open_custom_cmp((fdb_file_handle **)local_23d0,"./dummy2",&local_2170,1,
                                (char **)in_R8,(fdb_custom_cmp_variable *)(local_23a8 + 0x10),
                                (void **)(local_23a8 + 8));
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_kvs_open_default
                        ((fdb_file_handle *)local_23d0._0_8_,(fdb_kvs_handle **)(local_23e8 + 0x10),
                         (fdb_kvs_config *)(local_23d0 + 0x10));
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001158ac;
      lVar9 = 0;
      while( true ) {
        in_R8 = (kvs_ops_stat *)0x0;
        fdb_doc_create((fdb_doc **)local_23e8,local_1f78[lVar9]->key,local_1f78[lVar9]->keylen,
                       (void *)0x0,0,(void *)0x0,0);
        fVar3 = fdb_get((fdb_kvs_handle *)local_23e8._16_8_,(fdb_doc *)local_23e8._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sVar5 = *(size_t *)(local_23e8._0_8_ + 0x10);
        pfVar6 = local_1f78[lVar9];
        if (sVar5 != pfVar6->bodylen) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                 );
          custom_compare_variable_test()::__test_pass = '\x01';
          sVar5 = *(size_t *)(local_23e8._0_8_ + 0x10);
          pfVar6 = local_1f78[lVar9];
          if (sVar5 != pfVar6->bodylen) {
            __assert_fail("rdoc->bodylen == doc[i]->bodylen",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xa94,"void custom_compare_variable_test()");
          }
        }
        uVar2 = local_23e8._0_8_;
        iVar4 = bcmp(*(btree **)(local_23e8._0_8_ + 0x40),(fdb_kvs_handle *)pfVar6->body,sVar5);
        if (iVar4 != 0) goto LAB_0011587e;
        fdb_doc_free((fdb_doc *)uVar2);
        local_23e8._0_8_ = (fdb_doc *)0x0;
        lVar9 = lVar9 + 1;
        if (lVar9 == 1000) {
          fdb_kvs_close((fdb_kvs_handle *)local_23e8._16_8_);
          fdb_close((fdb_file_handle *)local_23d0._0_8_);
          lVar9 = 0;
          do {
            fdb_doc_free(local_1f78[lVar9]);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 1000);
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (custom_compare_variable_test()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"custom compare function for variable length key test");
          return;
        }
      }
      goto LAB_00115879;
    }
  }
  else {
LAB_0011588e:
    custom_compare_variable_test();
LAB_00115893:
    custom_compare_variable_test();
LAB_00115898:
    custom_compare_variable_test();
LAB_0011589d:
    custom_compare_variable_test();
LAB_001158a2:
    custom_compare_variable_test();
  }
  custom_compare_variable_test();
LAB_001158ac:
  custom_compare_variable_test();
  if (in_R8 != (kvs_ops_stat *)0x0) {
    return;
  }
  __assert_fail("user_param",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x9c2,"int _cmp_variable(void *, size_t, void *, size_t, void *)");
LAB_00115850:
  custom_compare_variable_test();
LAB_00115855:
  custom_compare_variable_test();
LAB_0011585a:
  custom_compare_variable_test();
LAB_0011585f:
  custom_compare_variable_test();
LAB_00115864:
  custom_compare_variable_test();
LAB_00115869:
  custom_compare_variable_test();
LAB_0011586e:
  custom_compare_variable_test();
LAB_00115879:
  custom_compare_variable_test();
LAB_0011587e:
  custom_compare_variable_test();
  goto LAB_00115889;
}

Assistant:

void custom_compare_variable_test()
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int n = 1000;
    int count;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *db2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    size_t keylen = 16;
    size_t prev_keylen;
    char keybuf[256], bodybuf[256];
    char prev_key[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.seqtree_opt = FDB_SEQTREE_USE;
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = true;

    uint64_t user_param = 0x1234;
    kvs_config.custom_cmp = _cmp_variable;
    kvs_config.custom_cmp_param = (void*)&user_param;

    // open db with custom compare function for variable length key type
    //fdb_open_cmp_variable(&dbfile, "./dummy1", &fconfig);
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "custom_compare_variable_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        for (j=0;j<2;++j){
            keybuf[j] = 'a' + rand()%('z'-'a');
        }
        sprintf(keybuf+2, "%06d", i);
        for (j=8;(size_t)j<keylen-1;++j){
            keybuf[j] = 'a' + rand()%('z'-'a');
        }
        keybuf[keylen-1] = 0;
        sprintf(bodybuf, "value: %d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, keylen, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        fdb_set(db, doc[i]);
    }

    // point query
    for (i=0;i<n;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(rdoc->bodylen == doc[i]->bodylen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // range scan (before flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    sprintf(prev_key, "%016d", 0);
    count = 0;
    prev_keylen = 16;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(_cmp_variable(prev_key, prev_keylen,
                               rdoc->key, rdoc->keylen,
                               kvs_config.custom_cmp_param) <= 0);
        prev_keylen = rdoc->keylen;
        memcpy(prev_key, rdoc->key, rdoc->keylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);
    fdb_iterator_close(iterator);

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // range scan (after flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    sprintf(prev_key, "%016d", 0);
    count = 0;
    prev_keylen = 16;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(_cmp_variable(prev_key, prev_keylen,
                               rdoc->key, rdoc->keylen,
                               kvs_config.custom_cmp_param) <= 0);
        prev_keylen = rdoc->keylen;
        memcpy(prev_key, rdoc->key, rdoc->keylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);
    fdb_iterator_close(iterator);

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // range scan (after compaction)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    sprintf(prev_key, "%016d", 0);
    count = 0;
    prev_keylen = 16;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(_cmp_variable(prev_key, prev_keylen,
                               rdoc->key, rdoc->keylen,
                               kvs_config.custom_cmp_param) <= 0);
        prev_keylen = rdoc->keylen;
        memcpy(prev_key, rdoc->key, rdoc->keylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);
    fdb_iterator_close(iterator);

    // range scan by sequence
    fdb_iterator_sequence_init(db, &iterator, 0, 0, 0x0);
    count = 0;
    do { // forward
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count == n);

    // Reverse direction
    for (; fdb_iterator_prev(iterator) != FDB_RESULT_ITERATOR_FAIL; --count) {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    };
    TEST_CHK(count == 0);
    fdb_iterator_close(iterator);

    // open another handle
    kvs_config.custom_cmp = NULL;
    kvs_config.custom_cmp_param = NULL;
    fdb_kvs_open_default(dbfile, &db2, &kvs_config);

    // point query
    for (i=0;i<n;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(rdoc->bodylen == doc[i]->bodylen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_kvs_close(db);
    fdb_kvs_close(db2);
    fdb_close(dbfile);

    // re-open check
    //status = fdb_open(&dbfile, "./dummy2", &fconfig);
    char* kvs_names[1] = {NULL};
    fdb_custom_cmp_variable functions[1] = {_cmp_variable};
    void* params[1] = {(void*)&user_param};
    status = fdb_open_custom_cmp(&dbfile, "./dummy2", &fconfig,
                                 1, kvs_names, functions, params);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // point query
    for (i=0;i<n;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(rdoc->bodylen == doc[i]->bodylen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("custom compare function for variable length key test");
}